

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O0

int envy_bios_parse_power_fan_calib(envy_bios *bios)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint offs;
  envy_bios_power_fan_calib *peVar4;
  envy_bios_power_fan_calib_entry *peVar5;
  uint32_t data;
  int err;
  int i;
  envy_bios_power_fan_calib *fan_calib;
  envy_bios *bios_local;
  
  peVar4 = &(bios->power).fan_calib;
  if (peVar4->offset == 0) {
    bios_local._4_4_ = -0x16;
  }
  else {
    bios_u8(bios,peVar4->offset,&(bios->power).fan_calib.version);
    if ((bios->power).fan_calib.version == '\x10') {
      iVar1 = bios_u8(bios,peVar4->offset + 1,&(bios->power).fan_calib.hlen);
      iVar2 = bios_u8(bios,peVar4->offset + 2,&(bios->power).fan_calib.rlen);
      iVar3 = bios_u8(bios,peVar4->offset + 3,&(bios->power).fan_calib.entriesnum);
      (bios->power).fan_calib.valid = ((iVar3 != 0 || (iVar2 != 0 || iVar1 != 0)) ^ 0xffU) & 1;
      peVar5 = (envy_bios_power_fan_calib_entry *)
               calloc((ulong)(bios->power).fan_calib.entriesnum,0x18);
      (bios->power).fan_calib.entries = peVar5;
      for (data = 0; (int)data < (int)(uint)(bios->power).fan_calib.entriesnum; data = data + 1) {
        offs = peVar4->offset + (uint)(bios->power).fan_calib.hlen +
               data * (bios->power).fan_calib.rlen;
        (bios->power).fan_calib.entries[(int)data].offset = offs;
        bios_u8(bios,offs,&(bios->power).fan_calib.entries[(int)data].enable);
        bios_u8(bios,offs + 1,&(bios->power).fan_calib.entries[(int)data].mode);
        bios_u16(bios,offs + 2,&(bios->power).fan_calib.entries[(int)data].unk02);
        bios_u16(bios,offs + 4,&(bios->power).fan_calib.entries[(int)data].unk04);
        bios_u16(bios,offs + 6,&(bios->power).fan_calib.entries[(int)data].unk06);
        bios_u16(bios,offs + 8,&(bios->power).fan_calib.entries[(int)data].pwm_freq);
        bios_u16(bios,offs + 10,&(bios->power).fan_calib.entries[(int)data].duty_max);
        bios_u16(bios,offs + 0xc,(uint16_t *)&(bios->power).fan_calib.entries[(int)data].duty_offset
                );
        bios_u16(bios,offs + 0xe,(uint16_t *)&(bios->power).fan_calib.entries[(int)data].unk0e);
        if (0x11 < (bios->power).fan_calib.rlen) {
          bios_u16(bios,offs + 0x10,&(bios->power).fan_calib.entries[(int)data].unk10);
        }
        if (0x13 < (bios->power).fan_calib.rlen) {
          bios_u16(bios,offs + 0x12,&(bios->power).fan_calib.entries[(int)data].unk12);
        }
      }
      bios_local._4_4_ = 0;
    }
    else {
      fprintf(_stderr,"Unknown FAN CALIBRATION table version 0x%x\n",
              (ulong)(bios->power).fan_calib.version);
      bios_local._4_4_ = -0x16;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_power_fan_calib(struct envy_bios *bios) {
	struct envy_bios_power_fan_calib *fan_calib = &bios->power.fan_calib;
	int i, err = 0;

	if (!fan_calib->offset)
		return -EINVAL;

	bios_u8(bios, fan_calib->offset + 0x0, &fan_calib->version);
	switch(fan_calib->version) {
	case 0x10:
		err |= bios_u8(bios, fan_calib->offset + 0x1, &fan_calib->hlen);
		err |= bios_u8(bios, fan_calib->offset + 0x2, &fan_calib->rlen);
		err |= bios_u8(bios, fan_calib->offset + 0x3, &fan_calib->entriesnum);
		fan_calib->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FAN CALIBRATION table version 0x%x\n", fan_calib->version);
		return -EINVAL;
	};

	err = 0;
	fan_calib->entries = calloc(fan_calib->entriesnum, sizeof(struct envy_bios_power_fan_calib_entry));
	for (i = 0; i < fan_calib->entriesnum; i++) {
		uint32_t data = fan_calib->offset + fan_calib->hlen + i * fan_calib->rlen;

		fan_calib->entries[i].offset = data;
		bios_u8(bios, data + 0x00, &fan_calib->entries[i].enable);
		bios_u8(bios, data + 0x01, &fan_calib->entries[i].mode);
		bios_u16(bios, data + 0x02, &fan_calib->entries[i].unk02);
		bios_u16(bios, data + 0x04, &fan_calib->entries[i].unk04);
		bios_u16(bios, data + 0x06, &fan_calib->entries[i].unk06);
		bios_u16(bios, data + 0x08, &fan_calib->entries[i].pwm_freq); /* not used by the blob */
		bios_u16(bios, data + 0x0a, &fan_calib->entries[i].duty_max);
		bios_u16(bios, data + 0x0c, (uint16_t*) &fan_calib->entries[i].duty_offset);
		bios_u16(bios, data + 0x0e, &fan_calib->entries[i].unk0e);

		if (fan_calib->rlen >= 0x12)
			bios_u16(bios, data + 0x10, &fan_calib->entries[i].unk10);

		if (fan_calib->rlen >= 0x14)
			bios_u16(bios, data + 0x12, &fan_calib->entries[i].unk12);
	}

	return 0;
}